

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

int32_t __thiscall icu_63::LocalizationInfo::indexForLocale(LocalizationInfo *this,UChar *locale)

{
  int iVar1;
  int32_t iVar2;
  UChar *s2;
  uint uVar3;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_LocalizationInfo[5])();
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      iVar1 = (*this->_vptr_LocalizationInfo[6])(this,(ulong)uVar3);
      s2 = (UChar *)CONCAT44(extraout_var,iVar1);
      if (s2 == locale) {
        return uVar3;
      }
      if ((s2 != (UChar *)0x0 && locale != (UChar *)0x0) &&
         (iVar2 = u_strcmp_63(locale,s2), iVar2 == 0)) {
        return uVar3;
      }
      uVar3 = uVar3 + 1;
      iVar1 = (*this->_vptr_LocalizationInfo[5])(this);
    } while ((int)uVar3 < iVar1);
  }
  return -1;
}

Assistant:

int32_t
LocalizationInfo::indexForLocale(const UChar* locale) const {
    for (int i = 0; i < getNumberOfDisplayLocales(); ++i) {
        if (streq(locale, getLocaleName(i))) {
            return i;
        }
    }
    return -1;
}